

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

void dg::vr::RelationsAnalyzer::remGen(ValueRelations *graph,BinaryOperator *rem)

{
  bool bVar1;
  Type *pTVar2;
  Value *in_RSI;
  ValueRelations *in_RDI;
  Constant *zero;
  Constant **in_stack_ffffffffffffffc8;
  ValueRelations *this;
  
  pTVar2 = llvm::Value::getType(in_RSI);
  llvm::ConstantInt::getSigned(pTVar2,0);
  this = in_RDI;
  llvm::BinaryOperator::getOperand
            ((BinaryOperator *)in_RDI,(uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  bVar1 = ValueRelations::isLesserEqual<llvm::Constant_const*,llvm::Value*>
                    (this,in_stack_ffffffffffffffc8,(Value **)0x1cefe8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ValueRelations::setLesserEqual<llvm::Constant_const*,llvm::BinaryOperator_const*>
              (this,in_stack_ffffffffffffffc8,(BinaryOperator **)0x1cf006);
    llvm::BinaryOperator::getOperand((BinaryOperator *)this,(uint)((ulong)in_RDI >> 0x20));
    ValueRelations::setLesser<llvm::BinaryOperator_const*,llvm::Value*>
              (this,(BinaryOperator **)in_RDI,(Value **)0x1cf036);
  }
  return;
}

Assistant:

void RelationsAnalyzer::remGen(ValueRelations &graph,
                               const llvm::BinaryOperator *rem) {
    assert(rem);
    const llvm::Constant *zero =
            llvm::ConstantInt::getSigned(rem->getType(), 0);

    if (!graph.isLesserEqual(zero, rem->getOperand(0)))
        return;

    graph.setLesserEqual(zero, rem);
    graph.setLesser(rem, rem->getOperand(1));
}